

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeGenerator(ExpressionContext *ctx,SynGenerator *syntax)

{
  uint uVar1;
  Allocator *allocator;
  ScopeData *scope;
  ExprBase **ppEVar2;
  bool bVar3;
  int iVar4;
  uint offset;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  FunctionData *this;
  TypeFunction *pTVar7;
  TypeRef *contextType;
  SynBase *pSVar8;
  ExprVariableDefinition *pEVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprBase *pEVar10;
  VariableData *pVVar11;
  undefined4 extraout_var_03;
  ExprBase *pEVar12;
  ExprBase *pEVar13;
  ExprVariableDefinition *first;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ExprFunctionAccess *this_00;
  long lVar14;
  char *pcVar15;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr IVar16;
  ExprBase *local_690;
  IntrusiveList<ExprBase> expressions;
  undefined8 local_658;
  undefined8 uStack_650;
  SmallArray<ArgumentData,_32U> arguments;
  SynIdentifier *pSVar6;
  undefined4 extraout_var_00;
  
  IVar16 = GetTemporaryFunctionName(ctx);
  arguments.allocator = ctx->allocator;
  lVar14 = 0x20;
  do {
    *(undefined8 *)((long)&local_658 + lVar14) = 0;
    *(undefined1 *)((long)arguments.little + lVar14 + -0x18) = 0;
    *(undefined8 *)((long)arguments.little + lVar14 + -0x10) = 0;
    *(undefined8 *)((long)arguments.little + lVar14 + -8) = 0;
    *(undefined8 *)((long)&arguments.little[0].source + lVar14) = 0;
    *(undefined8 *)(&arguments.little[0].isExplicit + lVar14) = 0;
    lVar14 = lVar14 + 0x30;
  } while (lVar14 != 0x620);
  arguments.data = arguments.little;
  arguments.count = 0;
  arguments.max = 0x20;
  pTVar5 = CreateFunctionContextType(ctx,&syntax->super_SynBase,IVar16);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pSVar6 = (SynIdentifier *)CONCAT44(extraout_var,iVar4);
  (pSVar6->super_SynBase).typeID = 4;
  (pSVar6->super_SynBase).begin = (Lexeme *)0x0;
  (pSVar6->super_SynBase).end = (Lexeme *)0x0;
  (pSVar6->super_SynBase).pos.begin = (char *)0x0;
  (pSVar6->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(pSVar6->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(pSVar6->super_SynBase).next + 2) = 0;
  (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
  pSVar6->name = IVar16;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_00,iVar4);
  allocator = ctx->allocator;
  scope = ctx->scope;
  arguments_00.count = arguments.count;
  arguments_00.data = arguments.data;
  arguments_00._12_4_ = 0;
  pTVar7 = ExpressionContext::GetFunctionType(ctx,&syntax->super_SynBase,ctx->typeAuto,arguments_00)
  ;
  contextType = ExpressionContext::GetReferenceType(ctx,pTVar5);
  uVar1 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar1 + 1;
  pcVar15 = (char *)0x1;
  FunctionData::FunctionData
            (this,allocator,&syntax->super_SynBase,scope,true,false,false,pTVar7,
             &contextType->super_TypeBase,pSVar6,(IntrusiveList<MatchData>)(ZEXT816(0) << 0x40),
             uVar1);
  IVar16.end = pcVar15;
  IVar16.begin = (this->name->name).end;
  anon_unknown.dwarf_c3752::CheckFunctionConflict
            ((anon_unknown_dwarf_c3752 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(this->name->name).begin,IVar16);
  ExpressionContext::AddFunction(ctx,this);
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = ctx->scope;
  pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  pEVar9 = CreateFunctionContextArgument(ctx,pSVar8,this);
  this->argumentsSize = this->functionScope->dataSize;
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  if (this->coroutine == true) {
    offset = anon_unknown.dwarf_c3752::AllocateVariableInScope
                       (ctx,&syntax->super_SynBase,ctx->typeInt->alignment,ctx->typeInt);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar6 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar4);
    (pSVar6->super_SynBase).typeID = 4;
    (pSVar6->super_SynBase).begin = (Lexeme *)0x0;
    (pSVar6->super_SynBase).end = (Lexeme *)0x0;
    (pSVar6->super_SynBase).pos.begin = (char *)0x0;
    (pSVar6->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(pSVar6->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(pSVar6->super_SynBase).next + 2) = 0;
    (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
    (pSVar6->name).begin = "$jmpOffset";
    (pSVar6->name).end = "";
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    pVVar11 = (VariableData *)CONCAT44(extraout_var_02,iVar4);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    VariableData::VariableData
              (pVVar11,ctx->allocator,&syntax->super_SynBase,ctx->scope,0,ctx->typeInt,pSVar6,offset
               ,uVar1);
    this->coroutineJumpOffset = pVVar11;
    bVar3 = anon_unknown.dwarf_c3752::IsLookupOnlyVariable((ExpressionContext *)ctx->scope,pVVar11);
    if (bVar3) {
      pVVar11->lookupOnly = true;
    }
    ExpressionContext::AddVariable(ctx,pVVar11,false);
    AddFunctionCoroutineVariable(ctx,&syntax->super_SynBase,this,this->coroutineJumpOffset);
    local_690 = CreateVariableAccess(ctx,&syntax->super_SynBase,this->coroutineJumpOffset,true);
  }
  else {
    local_690 = (ExprBase *)0x0;
  }
  pSVar8 = (syntax->expressions).head;
  if (pSVar8 != (SynBase *)0x0) {
    do {
      pEVar10 = AnalyzeStatement(ctx,pSVar8);
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
      pSVar8 = pSVar8->next;
    } while (pSVar8 != (SynBase *)0x0);
  }
  if (this->hasExplicitReturn == false) {
    pcVar15 = "ERROR: not a single element is generated, and an array element type is unknown";
  }
  else {
    pTVar5 = this->type->returnType;
    if (pTVar5 != ctx->typeVoid) {
      pVVar11 = anon_unknown.dwarf_c3752::AllocateTemporary(ctx,&syntax->super_SynBase,pTVar5);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_03,iVar4);
      pTVar5 = ctx->typeVoid;
      pEVar12 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar11,false);
      pEVar13 = CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,this,0);
      pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pSVar8 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,this,ctx->scope);
      pEVar10->typeID = 0x1c;
      pEVar10->source = &syntax->super_SynBase;
      pEVar10->type = pTVar5;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240b60;
      pEVar10[1]._vptr_ExprBase = (_func_int **)pEVar12;
      *(ExprBase **)&pEVar10[1].typeID = pEVar13;
      pEVar10[1].source = pSVar8;
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
      goto LAB_0017af3d;
    }
    pcVar15 = "ERROR: cannot generate an array of \'void\' element type";
  }
  anon_unknown.dwarf_c3752::Report(ctx,&syntax->super_SynBase,pcVar15);
LAB_0017af3d:
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
  pVVar11 = CreateFunctionContextVariable(ctx,&syntax->super_SynBase,this,(FunctionData *)0x0);
  first = CreateFunctionContextVariableDefinition
                    (ctx,&syntax->super_SynBase,this,(FunctionData *)0x0,pVVar11);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar13 = (ExprBase *)CONCAT44(extraout_var_04,iVar4);
  pTVar7 = this->type;
  local_658 = expressions.head;
  pEVar10 = local_658;
  uStack_650 = expressions.tail;
  pEVar12 = uStack_650;
  pEVar13->typeID = 0x24;
  pEVar13->source = &syntax->super_SynBase;
  pEVar13->type = &pTVar7->super_TypeBase;
  pEVar13->next = (ExprBase *)0x0;
  pEVar13->listed = false;
  pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240b98;
  pEVar13[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar13[1].typeID = pEVar9;
  pEVar13[1].source = (SynBase *)0x0;
  pEVar13[1].type = (TypeBase *)0x0;
  pEVar13[1].next = local_690;
  local_658._0_4_ = SUB84(expressions.head,0);
  local_658._4_4_ = (undefined4)((ulong)expressions.head >> 0x20);
  uStack_650._0_4_ = SUB84(expressions.tail,0);
  uStack_650._4_4_ = (undefined4)((ulong)expressions.tail >> 0x20);
  *(undefined4 *)&pEVar13[1].listed = (undefined4)local_658;
  *(undefined4 *)&pEVar13[1].field_0x2c = local_658._4_4_;
  *(undefined4 *)&pEVar13[2]._vptr_ExprBase = (undefined4)uStack_650;
  *(undefined4 *)((long)&pEVar13[2]._vptr_ExprBase + 4) = uStack_650._4_4_;
  *(ExprVariableDefinition **)&pEVar13[2].typeID = first;
  pEVar13[2].source = (SynBase *)pVVar11;
  this->declaration = pEVar13;
  uVar1 = (ctx->definitions).count;
  local_658 = pEVar10;
  uStack_650 = pEVar12;
  if (uVar1 == (ctx->definitions).max) {
    SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar1);
  }
  ppEVar2 = (ctx->definitions).data;
  if (ppEVar2 != (ExprBase **)0x0) {
    pEVar10 = this->declaration;
    uVar1 = (ctx->definitions).count;
    (ctx->definitions).count = uVar1 + 1;
    ppEVar2[uVar1] = pEVar10;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this_00 = (ExprFunctionAccess *)CONCAT44(extraout_var_05,iVar4);
    pTVar7 = this->type;
    pEVar10 = CreateFunctionContextAccess(ctx,&syntax->super_SynBase,this);
    ExprFunctionAccess::ExprFunctionAccess
              (this_00,&syntax->super_SynBase,&pTVar7->super_TypeBase,this,pEVar10);
    if (first != (ExprVariableDefinition *)0x0) {
      this_00 = (ExprFunctionAccess *)
                CreateSequence(ctx,&syntax->super_SynBase,&first->super_ExprBase,(ExprBase *)this_00
                              );
    }
    name.end = "";
    name.begin = "__gen_list";
    pEVar10 = CreateFunctionCall1(ctx,&syntax->super_SynBase,name,&this_00->super_ExprBase,false,
                                  true,true);
    SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
    return pEVar10;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]");
}

Assistant:

ExprBase* AnalyzeGenerator(ExpressionContext &ctx, SynGenerator *syntax)
{
	InplaceStr functionName = GetTemporaryFunctionName(ctx);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextClassType = CreateFunctionContextType(ctx, syntax, functionName);

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntax, ctx.scope, true, false, false, ctx.GetFunctionType(syntax, ctx.typeAuto, arguments), ctx.GetReferenceType(contextClassType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, syntax, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(syntax), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> expressions;

	if(function->coroutine)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeInt->alignment, ctx.typeInt);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

		function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

		if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
			function->coroutineJumpOffset->lookupOnly = true;

		ctx.AddVariable(function->coroutineJumpOffset, false);

		AddFunctionCoroutineVariable(ctx, syntax, function, function->coroutineJumpOffset);

		coroutineStateRead = CreateVariableAccess(ctx, syntax, function->coroutineJumpOffset, true);
	}

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	if(!function->hasExplicitReturn)
	{
		Report(ctx, syntax, "ERROR: not a single element is generated, and an array element type is unknown");
	}
	else if(function->type->returnType == ctx.typeVoid)
	{
		Report(ctx, syntax, "ERROR: cannot generate an array of 'void' element type");
	}
	else
	{
		VariableData *empty = AllocateTemporary(ctx, syntax, function->type->returnType);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, CreateVariableAccess(ctx, syntax, empty, false), CreateFunctionCoroutineStateUpdate(ctx, syntax, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(syntax), function, ctx.scope)));
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = CreateFunctionContextVariable(ctx, syntax, function, NULL);
	ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, function, NULL, contextVariable);

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntax, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), coroutineStateRead, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(syntax, function->type, function, CreateFunctionContextAccess(ctx, syntax, function));

	return CreateFunctionCall1(ctx, syntax, InplaceStr("__gen_list"), contextVariableDefinition ? CreateSequence(ctx, syntax, contextVariableDefinition, access) : access, false, true, true);
}